

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O1

double __thiscall
singular::Svd<60,_50>::BidiagonalMatrix::applyRotatorFromLeft
          (BidiagonalMatrix *this,Rotator *r,int n,double bulge)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  
  pdVar5 = this->pBlock;
  lVar6 = (long)(n * 2);
  dVar7 = pdVar5[lVar6 + 1];
  dVar1 = r->elements[0];
  dVar2 = r->elements[2];
  dVar3 = r->elements[3];
  dVar4 = r->elements[1];
  pdVar5[lVar6] = pdVar5[lVar6] * dVar1 + bulge * dVar2;
  pdVar5[lVar6 + 1] = pdVar5[lVar6 + 2] * dVar2 + dVar1 * dVar7;
  pdVar5[lVar6 + 2] = pdVar5[lVar6 + 2] * dVar3 + dVar7 * dVar4;
  dVar7 = 0.0;
  if (n < 0x30) {
    dVar7 = dVar2 * pdVar5[lVar6 + 3];
    pdVar5[lVar6 + 3] = dVar3 * pdVar5[lVar6 + 3];
  }
  return dVar7;
}

Assistant:

double applyRotatorFromLeft(const Rotator& r, int n, double bulge) {
				double* p = this->pBlock + n * 2;
				double b1 = p[0];
				double g1 = p[1];
				double b2 = p[2];
				double r11 = r(0, 0);
				double r12 = r(0, 1);
				double r21 = r(1, 0);
				double r22 = r(1, 1);
				p[0] = r11 * b1 + r21 * bulge;
				p[1] = r11 * g1 + r21 * b2;
				p[2] = r12 * g1 + r22 * b2;
				double newBulge;
				if (n < N - 2) {
					double g2 = p[3];
					newBulge = r21 * g2;
					p[3] = r22 * g2;
				} else {
					newBulge = 0.0;
				}
				return newBulge;
			}